

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

void __thiscall wabt::Var::Destroy(Var *this)

{
  long *plVar1;
  long *plVar2;
  
  if (this->type_ == Name) {
    plVar1 = (long *)(this->field_2).name_._M_dataplus._M_p;
    plVar2 = (long *)((long)&this->field_2 + 0x10);
    if (plVar1 != plVar2) {
      operator_delete(plVar1,*plVar2 + 1);
      return;
    }
  }
  return;
}

Assistant:

bool is_name() const { return type_ == VarType::Name; }